

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldIteratorTest_ConstReverseIteration_Test::
~RepeatedPtrFieldIteratorTest_ConstReverseIteration_Test
          (RepeatedPtrFieldIteratorTest_ConstReverseIteration_Test *this)

{
  (this->super_RepeatedPtrFieldIteratorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__RepeatedPtrFieldIteratorTest_018ba658;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedPtrField(&(this->super_RepeatedPtrFieldIteratorTest).proto_array_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldIteratorTest, ConstReverseIteration) {
  const RepeatedPtrField<std::string>& const_proto_array = proto_array_;
  RepeatedPtrField<std::string>::const_reverse_iterator iter =
      const_proto_array.rbegin();
  EXPECT_EQ("baz", *iter);
  ++iter;
  EXPECT_EQ("bar", *(iter++));
  EXPECT_EQ("foo", *iter);
  ++iter;
  EXPECT_TRUE(const_proto_array.rend() == iter);
  EXPECT_EQ("foo", *(--const_proto_array.rend()));
}